

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O1

bool __thiscall
Qentem::Value<char16_t>::
CopyValueTo<Qentem::StringStream<char16_t>,void(Qentem::StringStream<char16_t>&,char16_t_const*,unsigned_int)>
          (Value<char16_t> *this,StringStream<char16_t> *stream,RealFormatInfo format,
          _func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *string_function)

{
  SizeT SVar1;
  uint uVar2;
  char16_t *pcVar3;
  char16_t *to;
  Value<char16_t> *number;
  uint uVar4;
  Char_T storage [20];
  char16_t acStack_48 [20];
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  switch(this->type_) {
  case String:
    pcVar3 = (this->field_0).string_.storage_;
    uVar2 = (this->field_0).array_.index_;
    if (string_function != (_func_void_StringStream<char16_t>_ptr_char16_t_ptr_uint *)0x0) {
      (*string_function)(stream,pcVar3,uVar2);
      return true;
    }
    uVar4 = stream->length_ + uVar2;
    if (stream->capacity_ < uVar4) {
      StringStream<char16_t>::expand(stream,uVar4);
    }
    Memory::Copy<unsigned_int>(stream->storage_ + stream->length_,pcVar3,uVar2 * 2);
    stream->length_ = uVar4;
    return true;
  case UIntLong:
    number = (this->field_0).array_.storage_;
    break;
  case IntLong:
    number = (this->field_0).array_.storage_;
    if ((long)number < 0) {
      SVar1 = stream->length_ + 1;
      if (stream->capacity_ == stream->length_) {
        StringStream<char16_t>::expand(stream,SVar1);
      }
      number = (Value<char16_t> *)-(long)number;
      stream->storage_[stream->length_] = L'-';
      stream->length_ = SVar1;
    }
    break;
  case Double:
    Digit::realToString<double,Qentem::StringStream<char16_t>,unsigned_long_long>
              (stream,(unsigned_long_long)(this->field_0).array_.storage_,format);
    return true;
  case True:
    uVar2 = stream->length_ + 4;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    pcVar3 = L"true";
    goto LAB_0012a309;
  case False:
    uVar2 = stream->length_ + 5;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    pcVar3 = L"false";
    uVar4 = 10;
    goto LAB_0012a30e;
  case Null:
    uVar2 = stream->length_ + 4;
    if (stream->capacity_ < uVar2) {
      StringStream<char16_t>::expand(stream,uVar2);
    }
    to = stream->storage_ + stream->length_;
    pcVar3 = L"null";
LAB_0012a309:
    uVar4 = 8;
    goto LAB_0012a30e;
  default:
    return false;
  }
  SVar1 = Digit::IntToString<false,char16_t,unsigned_long_long>
                    ((char16_t *)&stack0xffffffffffffffe0,(unsigned_long_long)number);
  uVar2 = stream->length_ + SVar1;
  if (stream->capacity_ < uVar2) {
    StringStream<char16_t>::expand(stream,uVar2);
  }
  pcVar3 = acStack_48 + (0x14 - SVar1);
  to = stream->storage_ + stream->length_;
  uVar4 = SVar1 * 2;
LAB_0012a30e:
  Memory::Copy<unsigned_int>(to,pcVar3,uVar4);
  stream->length_ = uVar2;
  return true;
}

Assistant:

bool CopyValueTo(StringStream_T             &stream,
                     const Digit::RealFormatInfo format          = Digit::RealFormatInfo{Config::DoublePrecision},
                     StringFunction_T           *string_function = nullptr) const {
        switch (Type()) {
            case ValueType::String: {
                if (string_function != nullptr) {
                    string_function(stream, string_.First(), string_.Length());
                } else {
                    stream.Write(string_.First(), string_.Length());
                }

                break;
            }

            case ValueType::UIntLong: {
                Digit::NumberToString(stream, number_.Natural);
                break;
            }

            case ValueType::IntLong: {
                Digit::NumberToString(stream, number_.Integer);
                break;
            }

            case ValueType::Double: {
                Digit::NumberToString(stream, number_.Real, format);
                break;
            }

            case ValueType::True: {
                stream.Write(JSONotation::TrueString, JSONotation::TrueStringLength);
                break;
            }

            case ValueType::False: {
                stream.Write(JSONotation::FalseString, JSONotation::FalseStringLength);
                break;
            }

            case ValueType::Null: {
                stream.Write(JSONotation::NullString, JSONotation::NullStringLength);
                break;
            }

            case ValueType::ValuePtr: {
                return value_->CopyValueTo(stream, format, string_function);
            }

            default: {
                return false;
            }
        }

        return true;
    }